

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O2

void cfd::api::json::DecodeRawTransactionResponse::CollectFieldName(void)

{
  CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> func_table;
  allocator local_f9;
  undefined1 local_f8 [48];
  code *local_c8;
  code *local_c0;
  code *local_b8;
  undefined8 local_b0;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (json_mapper_abi_cxx11_._40_8_ == 0) {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_f8._8_8_ = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_f8._0_8_ = GetTxidString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionResponse_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionResponse_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetTxidString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_b8 = GetTxidFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
    ::
    _M_emplace_unique<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
                *)json_mapper_abi_cxx11_,(char (*) [5])0x283d83,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"txid",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetHashString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionResponse_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionResponse_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetHashString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetHashFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
    ::
    _M_emplace_unique<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
                *)json_mapper_abi_cxx11_,(char (*) [5])0x283c01,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"hash",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetVersionString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionResponse_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionResponse_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetVersionString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetVersionFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
    ::
    _M_emplace_unique<char_const(&)[8],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
                *)json_mapper_abi_cxx11_,(char (*) [8])"version",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"version",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetSizeString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionResponse_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionResponse_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetSizeString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetSizeFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
    ::
    _M_emplace_unique<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
                *)json_mapper_abi_cxx11_,(char (*) [5])0x283c7f,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"size",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetVsizeString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionResponse_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionResponse_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetVsizeString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetVsizeFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
    ::
    _M_emplace_unique<char_const(&)[6],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
                *)json_mapper_abi_cxx11_,(char (*) [6])"vsize",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"vsize",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetWeightString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionResponse_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionResponse_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetWeightString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetWeightFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
    ::
    _M_emplace_unique<char_const(&)[7],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
                *)json_mapper_abi_cxx11_,(char (*) [7])"weight",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"weight",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetLocktimeString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionResponse_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionResponse_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetLocktimeString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetLocktimeFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
    ::
    _M_emplace_unique<char_const(&)[9],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
                *)json_mapper_abi_cxx11_,(char (*) [9])"locktime",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"locktime",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetVinString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionResponse_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionResponse_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetVinString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetVinFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
    ::
    _M_emplace_unique<char_const(&)[4],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
                *)json_mapper_abi_cxx11_,(char (*) [4])"vin",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"vin",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetVoutString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionResponse_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::DecodeRawTransactionResponse_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::DecodeRawTransactionResponse_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetVoutString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&),_void_(*)(cfd::api::json::DecodeRawTransactionResponse_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetVoutFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
    ::
    _M_emplace_unique<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>>>>
                *)json_mapper_abi_cxx11_,(char (*) [5])"vout",
               (CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)&local_98);
    std::__cxx11::string::string((string *)local_f8,"vout",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::DecodeRawTransactionResponse> *)&local_98);
  }
  return;
}

Assistant:

XpubDataStruct XpubData::ConvertToStruct() const {  // NOLINT
  XpubDataStruct result;
  result.base58 = base58_;
  result.hex = hex_;
  result.ignore_items = ignore_items;
  return result;
}